

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

uint luaH_realasize(Table *t)

{
  uint uVar1;
  uint size;
  Table *t_local;
  
  if (((t->flags & 0x80) == 0) || ((t->alimit & t->alimit - 1) == 0)) {
    t_local._4_4_ = t->alimit;
  }
  else {
    uVar1 = t->alimit >> 1 | t->alimit;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    t_local._4_4_ = (uVar1 >> 0x10 | uVar1) + 1;
  }
  return t_local._4_4_;
}

Assistant:

LUAI_FUNC unsigned int luaH_realasize (const Table *t) {
  if (limitequalsasize(t))
    return t->alimit;  /* this is the size */
  else {
    unsigned int size = t->alimit;
    /* compute the smallest power of 2 not smaller than 'n' */
    size |= (size >> 1);
    size |= (size >> 2);
    size |= (size >> 4);
    size |= (size >> 8);
#if (UINT_MAX >> 14) > 3  /* unsigned int has more than 16 bits */
    size |= (size >> 16);
#if (UINT_MAX >> 30) > 3
    size |= (size >> 32);  /* unsigned int has more than 32 bits */
#endif
#endif
    size++;
    lua_assert(ispow2(size) && size/2 < t->alimit && t->alimit < size);
    return size;
  }
}